

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_property_int(nk_context *ctx,char *name,int min,int *val,int max,int step,
                    float inc_per_pixel)

{
  nk_property_variant local_38;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5d86,
                  "void nk_property_int(struct nk_context *, const char *, int, int *, int, int, float)"
                 );
  }
  if (name != (char *)0x0) {
    if (val != (int *)0x0) {
      if (ctx->current != (nk_window *)0x0) {
        local_38.value.i = *val;
        local_38.kind = NK_PROPERTY_INT;
        local_38.min_value.i = min;
        local_38.max_value.i = max;
        local_38.step.i = step;
        nk_property(ctx,name,&local_38,inc_per_pixel,NK_FILTER_INT);
        *val = local_38.value.i;
      }
      return;
    }
    __assert_fail("val",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5d88,
                  "void nk_property_int(struct nk_context *, const char *, int, int *, int, int, float)"
                 );
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x5d87,
                "void nk_property_int(struct nk_context *, const char *, int, int *, int, int, float)"
               );
}

Assistant:

NK_API void
nk_property_int(struct nk_context *ctx, const char *name,
    int min, int *val, int max, int step, float inc_per_pixel)
{
    struct nk_property_variant variant;
    NK_ASSERT(ctx);
    NK_ASSERT(name);
    NK_ASSERT(val);

    if (!ctx || !ctx->current || !name || !val) return;
    variant = nk_property_variant_int(*val, min, max, step);
    nk_property(ctx, name, &variant, inc_per_pixel, NK_FILTER_INT);
    *val = variant.value.i;
}